

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

void ovf::detail::write::append_data_bin_to_string<double>
               (string *output_to_file,double *vf,int n_cols,int n_rows,int format)

{
  int j;
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint64_t in;
  undefined1 local_88 [16];
  ulong local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_check;
  
  if (format == 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out_check,4,(allocator_type *)&in);
    endian::to_little_32
              (&check::val_4b,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    in = (uint64_t)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&in,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 4);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&in);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out,(long)(n_cols * 4),(allocator_type *)&in);
    local_78 = (long)n_cols << 2;
    iVar3 = 0;
    uVar4 = 0;
    if (0 < n_cols) {
      uVar4 = (ulong)(uint)n_cols;
    }
    for (iVar1 = 0; iVar1 != n_rows; iVar1 = iVar1 + 1) {
      for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        *(float *)(out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar2 * 4) =
             (float)vf[(uint)((int)uVar2 + iVar3)];
      }
      in = (uint64_t)local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&in,
                 out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + local_78);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&in);
      iVar3 = iVar3 + n_cols;
    }
  }
  else {
    if (format != 2) goto LAB_00144627;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out_check,8,(allocator_type *)&in);
    endian::to_little_64
              (&check::val_8b,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    in = (uint64_t)local_88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&in,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + 8);
    std::__cxx11::string::append((string *)output_to_file);
    std::__cxx11::string::~string((string *)&in);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out,(long)(n_cols * 8),(allocator_type *)&in);
    uVar4 = 0;
    uVar2 = 0;
    if (0 < n_cols) {
      uVar2 = (ulong)(uint)n_cols;
    }
    for (iVar3 = 0; iVar3 != n_rows; iVar3 = iVar3 + 1) {
      local_78 = uVar4;
      for (lVar5 = 0; uVar2 * 8 != lVar5; lVar5 = lVar5 + 8) {
        in = (uint64_t)vf[uVar4];
        endian::to_little_64
                  (&in,out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_start + lVar5);
        uVar4 = (ulong)((int)uVar4 + 1);
      }
      in = (uint64_t)local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&in,
                 out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + (long)n_cols * 8);
      std::__cxx11::string::append((string *)output_to_file);
      std::__cxx11::string::~string((string *)&in);
      uVar4 = (ulong)(uint)((int)local_78 + n_cols);
    }
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_00144627:
  std::__cxx11::string::append((char *)output_to_file);
  return;
}

Assistant:

void append_data_bin_to_string( std::string & output_to_file, const T * vf, int n_cols, int n_rows, int format)
    try
    {
        if( format == OVF_FORMAT_BIN8 )
        {
            auto out_check = std::vector<uint8_t>(8);
            endian::to_little_64(check::val_8b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(double) );

            std::vector<uint8_t> out(n_cols*8);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    double val = static_cast<double>(vf[n_cols*i + j]);
                    uint64_t in = *reinterpret_cast<uint64_t*>(&val);

                    endian::to_little_64(in, &out[j*8]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(double) );
            }
        }
        else if( format == OVF_FORMAT_BIN4 )
        {
            auto out_check = std::vector<uint8_t>(4);
            endian::to_little_32(check::val_4b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(float) );

            std::vector<uint8_t> out(n_cols*4);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    float val = static_cast<float>(vf[n_cols*i + j]);
                    uint32_t in = *reinterpret_cast<uint32_t*>(&val);

                    endian::to_little_32(in, &out[j*4]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(float) );
            }
        }

        output_to_file += "\n";
    }
    catch( ... )
    {

    }